

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::connected(shared_ptr<kratos::Port> *port,
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *bits)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  uint uVar2;
  int iVar3;
  VarType VVar4;
  uint uVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  Var **ppVVar7;
  element_type *peVar8;
  undefined4 extraout_var_01;
  element_type *peVar9;
  VarException *this_01;
  size_type sVar10;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  uint local_12c;
  _Node_iterator_base<unsigned_int,_false> _Stack_128;
  uint32_t i_1;
  undefined1 local_120;
  uint local_114 [2];
  uint32_t i;
  element_type *local_108;
  element_type **local_100;
  size_type local_f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_f0;
  allocator<char> local_d1;
  string local_d0;
  uint local_b0;
  uint local_ac;
  uint32_t low;
  uint32_t high;
  Var *ptr_parent;
  shared_ptr<kratos::VarSlice> ptr;
  Var *src;
  shared_ptr<kratos::AssignStmt> *stmt;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sources;
  bool result;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *bits_local;
  shared_ptr<kratos::Port> *port_local;
  
  sources._M_h._M_single_bucket._7_1_ = 0;
  peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )port);
  uVar2 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::reserve(bits,(ulong)uVar2);
  peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )port);
  iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
  bVar1 = std::
          unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)CONCAT44(extraout_var,iVar3));
  if (bVar1) {
LAB_003cb926:
    if ((sources._M_h._M_single_bucket._7_1_ & 1) != 0) {
      sVar10 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::size(bits);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)port);
      uVar2 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
      if (sVar10 != uVar2) {
        sources._M_h._M_single_bucket._7_1_ = 0;
      }
    }
    return (bool)(sources._M_h._M_single_bucket._7_1_ & 1);
  }
  peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )port);
  iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range2,
                  (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)CONCAT44(extraout_var_00,iVar3));
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range2);
  stmt = (shared_ptr<kratos::AssignStmt> *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)&__range2);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                       ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt);
    if (!bVar1) goto LAB_003cb910;
    this = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
           operator*(&__end2);
    this_00 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this);
    ppVVar7 = AssignStmt::left(this_00);
    VVar4 = Var::type(*ppVVar7);
    if (VVar4 != Slice) break;
    Var::as<kratos::VarSlice>((Var *)&ptr_parent);
    peVar8 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ptr_parent);
    iVar3 = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x29])();
    _low = (element_type *)CONCAT44(extraout_var_01,iVar3);
    peVar9 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                       (&port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>);
    if ((element_type *)CONCAT44(extraout_var_01,iVar3) == peVar9) {
      peVar8 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptr_parent);
      uVar2 = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x2b])();
      if ((uVar2 & 1) == 0) {
        peVar8 = std::
                 __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptr_parent);
        local_b0 = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x26])();
        peVar8 = std::
                 __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptr_parent);
        local_ac = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x25])();
      }
      else {
        local_b0 = 0;
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)port);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
        local_ac = iVar3 - 1;
      }
      for (local_114[0] = local_b0; local_114[0] <= local_ac; local_114[0] = local_114[0] + 1) {
        pVar11 = std::
                 unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                 ::emplace<unsigned_int&>
                           ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                             *)bits,local_114);
        _Stack_128._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_120 = pVar11.second;
      }
      local_114[1] = 0;
    }
    else {
      peVar8 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptr_parent);
      uVar2 = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[0x2b])();
      if ((uVar2 & 1) == 0) {
        i._2_1_ = 1;
        this_01 = (VarException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Internal error. Variable has un-related sources",&local_d1);
        local_108 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                              (&port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>);
        local_100 = &local_108;
        local_f8 = 1;
        std::allocator<const_kratos::IRNode_*>::allocator
                  ((allocator<const_kratos::IRNode_*> *)((long)&i + 3));
        __l._M_len = local_f8;
        __l._M_array = (iterator)local_100;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_f0,__l,(allocator<const_kratos::IRNode_*> *)((long)&i + 3));
        VarException::VarException(this_01,&local_d0,&local_f0);
        i._2_1_ = 0;
        __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
      }
      local_114[1] = 3;
    }
    std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)&ptr_parent);
    std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator++
              (&__end2);
  }
  sources._M_h._M_single_bucket._7_1_ = 1;
  local_12c = 0;
  while( true ) {
    uVar2 = local_12c;
    peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)port);
    uVar5 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
    if (uVar5 <= uVar2) break;
    std::
    unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
    ::emplace<unsigned_int&>
              ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                *)bits,&local_12c);
    local_12c = local_12c + 1;
  }
LAB_003cb910:
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range2);
  goto LAB_003cb926;
}

Assistant:

bool connected(const std::shared_ptr<Port>& port, std::unordered_set<uint32_t>& bits) {
    bool result = false;
    bits.reserve(port->width());
    if (!port->sources().empty()) {
        // it has been assigned. need to compute all the slices
        auto sources = port->sources();
        for (const auto& stmt : sources) {
            auto* src = stmt->left();
            if (src->type() == VarType::Slice) {
                auto ptr = src->as<VarSlice>();
                auto* ptr_parent = ptr->get_var_root_parent();
                uint32_t high, low;
                if (ptr_parent != port.get()) {
                    // it got be a sliced by var
                    if (!ptr->sliced_by_var())
                        throw VarException("Internal error. Variable has un-related sources",
                                           {port.get()});
                    // it's actually not driven by the current net
                    continue;
                } else {
                    if (ptr->sliced_by_var()) {
                        // possibly to hit all bits
                        low = 0;
                        high = port->width() - 1;
                    } else {
                        low = ptr->var_low();
                        high = ptr->var_high();
                    }
                }
                for (uint32_t i = low; i <= high; i++) {
                    bits.emplace(i);
                }
            } else {
                result = true;
                for (uint32_t i = 0; i < port->width(); i++) bits.emplace(i);
                break;
            }
        }
    }
    if (result && bits.size() != port->width()) result = false;
    return result;
}